

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  size_t srclen;
  uchar *local_40;
  CURLcode result;
  uchar *pw;
  size_t len;
  uchar *ntbuffer_local;
  char *password_local;
  
  srclen = strlen(password);
  if (srclen < 0x8000000000000000) {
    if (srclen == 0) {
      local_40 = (uchar *)(*Curl_cstrdup)("");
    }
    else {
      local_40 = (uchar *)(*Curl_cmalloc)(srclen << 1);
    }
    if (local_40 == (uchar *)0x0) {
      password_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      ascii_to_unicode_le(local_40,password,srclen);
      password_local._4_4_ = Curl_md4it(ntbuffer,local_40,srclen << 1);
      if (password_local._4_4_ == CURLE_OK) {
        memset(ntbuffer + 0x10,0,5);
      }
      (*Curl_cfree)(local_40);
    }
  }
  else {
    password_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return password_local._4_4_;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  CURLcode result;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  result = Curl_md4it(ntbuffer, pw, 2 * len);
  if(!result)
    memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return result;
}